

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  int *piVar4;
  sockaddr_storage *psVar5;
  int iVar6;
  bool bVar7;
  long lStack_100;
  uv_buf_t local_f8;
  msghdr local_e8;
  sockaddr_storage peer;
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x8c,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) != 0) {
    if (*(long *)&w[-1].fd == 0) {
      __assert_fail("handle->recv_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0xa0,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    lVar2._0_4_ = w[-1].pevents;
    lVar2._4_4_ = w[-1].events;
    if (lVar2 == 0) {
      __assert_fail("handle->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0xa1,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    local_e8.msg_controllen = 0;
    local_e8.msg_flags = 0;
    local_e8._52_4_ = 0;
    local_e8.msg_iovlen = 0;
    local_e8.msg_control = (void *)0x0;
    local_e8.msg_namelen = 0;
    local_e8._12_4_ = 0;
    local_e8.msg_iov = (iovec *)0x0;
    local_e8.msg_name = &peer;
    iVar6 = 0x20;
    while( true ) {
      local_f8 = uv_buf_init((char *)0x0,0);
      (**(code **)&w[-1].pevents)(handle,0x10000,&local_f8);
      if ((local_f8.base == (char *)0x0) || (local_f8.len == 0)) break;
      local_e8.msg_namelen = 0x80;
      local_e8.msg_iovlen = 1;
      local_e8.msg_iov = (iovec *)&local_f8;
      while (sVar3 = recvmsg(w->fd,&local_e8,0), sVar3 == -1) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        if ((long)iVar1 != 4) {
          if (iVar1 == 0xb) {
            lStack_100 = 0;
          }
          else {
            lStack_100 = -(long)iVar1;
          }
          goto LAB_0040b3ae;
        }
      }
      psVar5 = &peer;
      if (local_e8.msg_namelen == 0) {
        psVar5 = (sockaddr_storage *)0x0;
      }
      (**(code **)&w[-1].fd)(handle,sVar3,&local_f8,psVar5,(uint)local_e8.msg_flags >> 4 & 2);
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (((bVar7) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0)) goto LAB_0040b3b7;
    }
    lStack_100 = -0x69;
LAB_0040b3ae:
    (**(code **)&w[-1].fd)(handle,lStack_100,&local_f8,0,0);
  }
LAB_0040b3b7:
  if ((revents & 4) != 0) {
    uv__udp_sendmsg((uv_udp_t *)handle);
    uv__udp_run_completed((uv_udp_t *)handle);
  }
  return;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}